

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON_MeshNgon * __thiscall ON_MeshNgonIterator::NextNgon(ON_MeshNgonIterator *this)

{
  TYPE TVar1;
  ON_MeshNgon *pOVar2;
  ON_MeshFace *fvi;
  uint local_44;
  uint local_40;
  uint local_3c;
  ON_MeshNgon *local_28;
  ON_MeshNgon *ngon;
  uint ni;
  uint fi;
  ON_MeshNgonIterator *this_local;
  
  local_28 = (ON_MeshNgon *)0x0;
  TVar1 = (this->m_current_ngon_ci).m_type;
  if (TVar1 == invalid_type) {
    this->m_current_ngon = 0;
    if ((this->m_current_ngon_ci).m_index != 1) {
      return (ON_MeshNgon *)0x0;
    }
    ON_COMPONENT_INDEX::Set(&this->m_current_ngon_ci,mesh_ngon,-1);
    this->m_iterator_index = 0xffffffff;
LAB_00759840:
    if ((this->m_current_ngon_ci).m_index == -1) {
      local_3c = 0;
    }
    else {
      local_3c = ON_COMPONENT_INDEX::UnsignedIndex(&this->m_current_ngon_ci);
      local_3c = local_3c + 1;
    }
    for (ngon._0_4_ = local_3c; (uint)ngon < this->m_mesh_ngon_count; ngon._0_4_ = (uint)ngon + 1) {
      pOVar2 = ON_Mesh::Ngon(this->m_mesh,(uint)ngon);
      if (pOVar2 != (ON_MeshNgon *)0x0) {
        if (this->m_iterator_index == 0xffffffff) {
          this->m_iterator_index = 0;
        }
        else {
          this->m_iterator_index = this->m_iterator_index + 1;
        }
        (this->m_current_ngon_ci).m_index = (uint)ngon;
        this->m_current_ngon = (ON__UINT_PTR)pOVar2;
        return pOVar2;
      }
    }
    ON_COMPONENT_INDEX::Set(&this->m_current_ngon_ci,mesh_face,-1);
  }
  else if (TVar1 != mesh_face) {
    if (TVar1 != mesh_ngon) goto LAB_00759a12;
    goto LAB_00759840;
  }
  local_28 = (ON_MeshNgon *)0x0;
  if ((this->m_current_ngon_ci).m_index == -1) {
    local_40 = 0;
  }
  else {
    local_40 = ON_COMPONENT_INDEX::UnsignedIndex(&this->m_current_ngon_ci);
    local_40 = local_40 + 1;
  }
  for (ngon._4_4_ = local_40; ngon._4_4_ < this->m_mesh_face_count; ngon._4_4_ = ngon._4_4_ + 1) {
    if (this->m_facedex_to_ngondex_map == (uint *)0x0) {
      local_44 = 0xffffffff;
    }
    else {
      local_44 = this->m_facedex_to_ngondex_map[ngon._4_4_];
    }
    if (this->m_mesh_ngon_count <= local_44) {
      fvi = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,ngon._4_4_);
      local_28 = ON_MeshNgon::NgonFromMeshFace(&this->m_ngon_buffer,ngon._4_4_,(uint *)fvi);
      if (local_28 != (ON_MeshNgon *)0x0) {
        if (this->m_iterator_index == 0xffffffff) {
          this->m_iterator_index = 0;
        }
        else {
          this->m_iterator_index = this->m_iterator_index + 1;
        }
        (this->m_current_ngon_ci).m_index = ngon._4_4_;
        this->m_current_ngon = (ON__UINT_PTR)local_28;
        return local_28;
      }
    }
  }
LAB_00759a12:
  ON_COMPONENT_INDEX::Set(&this->m_current_ngon_ci,invalid_type,0);
  this->m_current_ngon = 0;
  return local_28;
}

Assistant:

const class ON_MeshNgon* ON_MeshNgonIterator::NextNgon()
{
  unsigned int fi, ni;
  
  const class ON_MeshNgon* ngon = 0;
  switch( m_current_ngon_ci.m_type )
  {
  case ON_COMPONENT_INDEX::invalid_type:
    m_current_ngon = 0;
    if ( 1 != m_current_ngon_ci.m_index )
      break;
    m_current_ngon_ci.Set(ON_COMPONENT_INDEX::mesh_ngon,-1);
    m_iterator_index = ON_UNSET_UINT_INDEX;
    // no break here - iterator will look through ngon list

  case ON_COMPONENT_INDEX::mesh_ngon:
    for ( ni = ( -1 == m_current_ngon_ci.m_index ) ? 0 : m_current_ngon_ci.UnsignedIndex()+1;
          ni < m_mesh_ngon_count;
          ni++
        )
    {
      ngon = m_mesh->Ngon(ni);
      if ( 0 == ngon )
        continue;
      if ( ON_UNSET_UINT_INDEX == m_iterator_index )
        m_iterator_index = 0;
      else
        m_iterator_index++;
      m_current_ngon_ci.m_index = (int)ni;
      m_current_ngon = (ON__UINT_PTR)ngon;
      return ngon;
    }
    m_current_ngon_ci.Set(ON_COMPONENT_INDEX::mesh_face,-1);
    // no break here - iterator will look for mesh faces that are not part of ngons

  case ON_COMPONENT_INDEX::mesh_face:
    for ( fi = ( -1 == m_current_ngon_ci.m_index ) ? 0 : m_current_ngon_ci.UnsignedIndex()+1;
          fi < m_mesh_face_count;
          fi++
        )
    {
      ni = m_facedex_to_ngondex_map ? m_facedex_to_ngondex_map[fi] : ON_UNSET_UINT_INDEX;
      if ( ni < m_mesh_ngon_count )
        continue;
      ngon = ON_MeshNgon::NgonFromMeshFace(m_ngon_buffer,fi,(const unsigned int*)m_mesh->m_F[fi].vi);
      if ( 0 == ngon )
        continue;
      if ( ON_UNSET_UINT_INDEX == m_iterator_index )
        m_iterator_index = 0;
      else
        m_iterator_index++;
      m_current_ngon_ci.m_index = (int)fi;
      m_current_ngon = (ON__UINT_PTR)ngon;
      return ngon;
    }
    // no break here - iterator is finished

  default:
    m_current_ngon_ci.Set(ON_COMPONENT_INDEX::invalid_type,0);
    m_current_ngon = 0;
  }

  return ngon;
}